

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

void __thiscall Json::Path::makePath(Path *this,string *path,InArgs *in)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  ArrayIndex index;
  char *pcVar4;
  char *pcVar5;
  const_iterator itInArg;
  string local_78;
  PathArgument local_58;
  
  pcVar5 = (path->_M_dataplus)._M_p;
  pcVar4 = pcVar5 + path->_M_string_length;
  itInArg._M_current =
       (in->
       super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>).
       _M_impl.super__Vector_impl_data._M_start;
  do {
    while( true ) {
      if (pcVar5 == pcVar4) {
        return;
      }
      cVar1 = *pcVar5;
      if (cVar1 != '%') break;
      addPathInArg(this,path,in,&itInArg,kindKey);
LAB_00143151:
      pcVar5 = pcVar5 + 1;
    }
    if (cVar1 == '.') goto LAB_00143151;
    pcVar2 = pcVar5;
    if (cVar1 == '[') {
      pcVar2 = pcVar5 + 1;
      if (pcVar5[1] == '%') {
        addPathInArg(this,path,in,&itInArg,kindIndex);
      }
      else {
        index = 0;
        for (; (pcVar2 != pcVar4 && ((byte)(*pcVar2 - 0x30U) < 10)); pcVar2 = pcVar2 + 1) {
          index = (uint)(byte)(*pcVar2 - 0x30U) + index * 10;
        }
        PathArgument::PathArgument(&local_58,index);
        path = &local_58.key_;
        std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>::
        emplace_back<Json::PathArgument>(&this->args_,&local_58);
        std::__cxx11::string::~string((string *)&local_58);
      }
      pcVar5 = pcVar2 + (pcVar2 != pcVar4);
    }
    else {
      for (; (((pcVar3 = pcVar4, pcVar2 != pcVar4 &&
               (cVar1 = *pcVar2, pcVar3 = pcVar2, cVar1 != '\0')) && (cVar1 != '.')) &&
             (cVar1 != '[')); pcVar2 = pcVar2 + 1) {
      }
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,pcVar5,pcVar3);
      PathArgument::PathArgument(&local_58,&local_78);
      path = &local_58.key_;
      std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>::
      emplace_back<Json::PathArgument>(&this->args_,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_78);
      pcVar5 = pcVar3;
    }
  } while( true );
}

Assistant:

void 
Path::makePath( const std::string &path,
                const InArgs &in )
{
   const char *current = path.c_str();
   const char *end = current + path.length();
   InArgs::const_iterator itInArg = in.begin();
   while ( current != end )
   {
      if ( *current == '[' )
      {
         ++current;
         if ( *current == '%' )
            addPathInArg( path, in, itInArg, PathArgument::kindIndex );
         else
         {
            ArrayIndex index = 0;
            for ( ; current != end && *current >= '0'  &&  *current <= '9'; ++current )
               index = index * 10 + ArrayIndex(*current - '0');
            args_.push_back( index );
         }
         if ( current == end  ||  *current++ != ']' )
            invalidPath( path, int(current - path.c_str()) );
      }
      else if ( *current == '%' )
      {
         addPathInArg( path, in, itInArg, PathArgument::kindKey );
         ++current;
      }
      else if ( *current == '.' )
      {
         ++current;
      }
      else
      {
         const char *beginName = current;
         while ( current != end  &&  !strchr( "[.", *current ) )
            ++current;
         args_.push_back( std::string( beginName, current ) );
      }
   }
}